

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::Square(Bignum *this)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int i;
  long lVar10;
  Bignum *pBVar11;
  Bignum *pBVar12;
  int bigit_index2_1;
  Bignum *pBVar13;
  int bigit_index2;
  long lVar14;
  
  sVar1 = this->used_bigits_;
  lVar5 = (long)sVar1 * 2;
  EnsureCapacity((int)lVar5);
  sVar2 = this->used_bigits_;
  lVar6 = (long)sVar2;
  if (lVar6 < 0x100) {
    lVar7 = 0;
    iVar9 = 0;
    if (0 < sVar2) {
      iVar9 = (int)sVar2;
    }
    pBVar12 = (Bignum *)(this->bigits_buffer_ + lVar6);
    for (; iVar9 != lVar7; lVar7 = lVar7 + 1) {
      *(Chunk *)((long)pBVar12->bigits_buffer_ + lVar7 * 4 + 0xfffffffffffffffcU) =
           this->bigits_buffer_[lVar7];
    }
    lVar7 = 1;
    uVar8 = 0;
    pBVar11 = pBVar12;
    for (lVar10 = 0; lVar10 != iVar9; lVar10 = lVar10 + 1) {
      pBVar13 = pBVar11;
      for (lVar14 = 0; lVar7 != lVar14; lVar14 = lVar14 + 1) {
        uVar3._0_2_ = pBVar13->used_bigits_;
        uVar3._2_2_ = pBVar13->exponent_;
        uVar8 = uVar8 + (ulong)*(uint *)((long)pBVar12->bigits_buffer_ +
                                        lVar14 * 4 + 0xfffffffffffffffcU) * (ulong)uVar3;
        pBVar13 = (Bignum *)((long)(pBVar13 + 0xffffffffffffffff) + 0x200);
      }
      this->bigits_buffer_[lVar10] = (uint)uVar8 & 0xfffffff;
      uVar8 = uVar8 >> 0x1c;
      lVar7 = lVar7 + 1;
      pBVar11 = (Bignum *)pBVar11->bigits_buffer_;
    }
    lVar7 = 1;
    for (lVar10 = lVar6; pBVar12 = (Bignum *)(this->bigits_buffer_ + lVar6 * 2 + -1), lVar14 = lVar7
        , SBORROW8(lVar10,lVar5) != lVar10 + (long)sVar1 * -2 < 0; lVar10 = lVar10 + 1) {
      for (; lVar14 < lVar6; lVar14 = lVar14 + 1) {
        uVar4._0_2_ = pBVar12->used_bigits_;
        uVar4._2_2_ = pBVar12->exponent_;
        uVar8 = uVar8 + (ulong)this->bigits_buffer_[lVar6 + lVar14] * (ulong)uVar4;
        pBVar12 = (Bignum *)((long)(pBVar12 + 0xffffffffffffffff) + 0x200);
      }
      this->bigits_buffer_[lVar10] = (uint)uVar8 & 0xfffffff;
      uVar8 = uVar8 >> 0x1c;
      lVar7 = lVar7 + 1;
    }
    this->used_bigits_ = (int16_t)lVar5;
    this->exponent_ = this->exponent_ << 1;
    Clamp(this);
    return;
  }
  abort();
}

Assistant:

void Bignum::Square() {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  const int product_length = 2 * used_bigits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_bigits_) {
    DOUBLE_CONVERSION_UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  const int copy_offset = used_bigits_;
  for (int i = 0; i < used_bigits_; ++i) {
    RawBigit(copy_offset + i) = RawBigit(i);
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_bigits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      const Chunk chunk1 = RawBigit(copy_offset + bigit_index1);
      const Chunk chunk2 = RawBigit(copy_offset + bigit_index2);
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    RawBigit(i) = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_bigits_; i < product_length; ++i) {
    int bigit_index1 = used_bigits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_bigits_) {
      const Chunk chunk1 = RawBigit(copy_offset + bigit_index1);
      const Chunk chunk2 = RawBigit(copy_offset + bigit_index2);
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten RawBigit(i) will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_bigits_.
    RawBigit(i) = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  DOUBLE_CONVERSION_ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_bigits_ = static_cast<int16_t>(product_length);
  exponent_ *= 2;
  Clamp();
}